

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

void __thiscall cmStateDirectory::SetCurrentSource(cmStateDirectory *this,string *dir)

{
  string *path;
  PointerType pBVar1;
  allocator<char> local_39;
  string local_38;
  
  pBVar1 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  path = &pBVar1->Location;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_38,path);
  std::__cxx11::string::operator=((string *)path,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  ComputeRelativePathTopSource(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_CURRENT_SOURCE_DIR",&local_39);
  cmStateSnapshot::SetDefinition(&this->Snapshot_,&local_38,path);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmStateDirectory::SetCurrentSource(std::string const& dir)
{
  std::string& loc = this->DirectoryState->Location;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  this->ComputeRelativePathTopSource();

  this->Snapshot_.SetDefinition("CMAKE_CURRENT_SOURCE_DIR", loc);
}